

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.h
# Opt level: O3

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
SetSingletonInstanceUnchecked
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          RecyclerWeakReference<Js::DynamicObject> *instance)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *addr;
  
  if (((this->super_DynamicTypeHandler).flags & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/SimpleDictionaryTypeHandler.h"
                                ,0xe3,"(!GetIsShared())","!GetIsShared()");
    if (!bVar2) goto LAB_00de1a6a;
    *puVar3 = 0;
  }
  if ((this->singletonInstance).ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/SimpleDictionaryTypeHandler.h"
                                ,0xe4,"(this->singletonInstance == nullptr)",
                                "this->singletonInstance == nullptr");
    if (!bVar2) {
LAB_00de1a6a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  addr = &this->singletonInstance;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = instance;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

virtual void SetSingletonInstanceUnchecked(RecyclerWeakReference<DynamicObject>* instance) override
        {
            Assert(!GetIsShared());
            Assert(this->singletonInstance == nullptr);
            this->singletonInstance = instance;
        }